

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGetTestPropertyCommand.cxx
# Opt level: O1

bool cmGetTestPropertyCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  pointer pbVar1;
  cmMakefile *this;
  bool bVar2;
  int iVar3;
  cmTest *this_00;
  cmValue cVar4;
  long lVar5;
  int iVar6;
  string *psVar7;
  string_view value;
  string_view value_00;
  string test_directory;
  cmMakefile *test_directory_makefile;
  string local_58;
  cmMakefile *local_38;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar5 = (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1;
  if ((lVar5 >> 5 != 3) && (lVar5 >> 5 != 5)) {
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_58,"called with incorrect number of arguments","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,
                      CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                               local_58.field_2._M_local_buf[0]) + 1);
    }
    return false;
  }
  local_58._M_string_length = 0;
  local_58.field_2._M_local_buf[0] = '\0';
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  iVar3 = std::__cxx11::string::compare((char *)(pbVar1 + 2));
  iVar6 = 2;
  if (lVar5 == 0xa0 && iVar3 == 0) {
    iVar6 = 4;
    std::__cxx11::string::_M_assign((string *)&local_58);
  }
  local_38 = status->Makefile;
  bVar2 = SetPropertyCommand::HandleAndValidateTestDirectoryScopes
                    (status,lVar5 == 0xa0 && iVar3 == 0,&local_58,&local_38);
  if (bVar2) {
    psVar7 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    this = status->Makefile;
    this_00 = cmMakefile::GetTest(local_38,psVar7);
    psVar7 = (string *)((long)&(psVar7->_M_dataplus)._M_p + (ulong)(uint)(iVar6 << 5));
    if (this_00 != (cmTest *)0x0) {
      pbVar1 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if (pbVar1[1]._M_string_length == 0) {
        cVar4.Value = (string *)0x0;
      }
      else {
        cVar4 = cmTest::GetProperty(this_00,pbVar1 + 1);
      }
      if (cVar4.Value != (string *)0x0) {
        value._M_str = ((cVar4.Value)->_M_dataplus)._M_p;
        value._M_len = (cVar4.Value)->_M_string_length;
        cmMakefile::AddDefinition(this,psVar7,value);
        goto LAB_003fe0b5;
      }
    }
    value_00._M_str = "NOTFOUND";
    value_00._M_len = 8;
    cmMakefile::AddDefinition(this,psVar7,value_00);
  }
LAB_003fe0b5:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,
                    CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                             local_58.field_2._M_local_buf[0]) + 1);
  }
  return bVar2;
}

Assistant:

bool cmGetTestPropertyCommand(std::vector<std::string> const& args,
                              cmExecutionStatus& status)
{
  std::vector<std::string>::size_type args_size = args.size();
  if (args_size != 3 && args_size != 5) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }

  std::string test_directory;
  bool test_directory_option_enabled = false;

  int var_arg_index = 2;
  if (args[2] == "DIRECTORY" && args_size == 5) {
    var_arg_index = 4;
    test_directory_option_enabled = true;
    test_directory = args[3];
  }

  cmMakefile* test_directory_makefile = &status.GetMakefile();
  bool file_scopes_handled =
    SetPropertyCommand::HandleAndValidateTestDirectoryScopes(
      status, test_directory_option_enabled, test_directory,
      test_directory_makefile);
  if (!file_scopes_handled) {
    return false;
  }

  std::string const& testName = args[0];
  std::string const& var = args[var_arg_index];
  cmMakefile& mf = status.GetMakefile();
  cmTest* test = test_directory_makefile->GetTest(testName);
  if (test) {
    cmValue prop;
    if (!args[1].empty()) {
      prop = test->GetProperty(args[1]);
    }
    if (prop) {
      mf.AddDefinition(var, prop);
      return true;
    }
  }
  mf.AddDefinition(var, "NOTFOUND");
  return true;
}